

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsFunctionParams<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsFunctionParams<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  long lVar1;
  long lVar2;
  ulong *puVar3;
  TestError *pTVar4;
  undefined1 *puVar5;
  long lVar6;
  string shader_source;
  string base_variable_string;
  string example_struct2;
  string example_struct1;
  string temp;
  long *local_480 [2];
  long local_470 [3];
  long *local_458 [2];
  long local_448 [2];
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  long *local_3f8 [2];
  long local_3e8 [2];
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248;
  ulong uStack_240;
  string variable_basenames [8];
  string full_variable_names [8];
  
  example_struct1._M_dataplus._M_p = (pointer)&example_struct1.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&example_struct1,"\nvoid my_function(","");
  example_struct2._M_dataplus._M_p = (pointer)&example_struct2.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&example_struct2,")\n{\n}\n\n","");
  base_variable_string._M_dataplus._M_p = (pointer)&base_variable_string.field_2;
  base_variable_string._M_string_length = 0;
  base_variable_string.field_2._M_local_buf[0] = '\0';
  variable_basenames[0]._M_dataplus._M_p = (pointer)&variable_basenames[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)variable_basenames,"v1","");
  variable_basenames[1]._M_dataplus._M_p = (pointer)&variable_basenames[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(variable_basenames + 1),"v2","");
  variable_basenames[2]._M_dataplus._M_p = (pointer)&variable_basenames[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(variable_basenames + 2),"v3","");
  variable_basenames[3]._M_dataplus._M_p = (pointer)&variable_basenames[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(variable_basenames + 3),"v4","");
  variable_basenames[4]._M_dataplus._M_p = (pointer)&variable_basenames[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(variable_basenames + 4),"v5","");
  variable_basenames[5]._M_dataplus._M_p = (pointer)&variable_basenames[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(variable_basenames + 5),"v6","");
  variable_basenames[6]._M_dataplus._M_p = (pointer)&variable_basenames[6].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(variable_basenames + 6),"v7","");
  variable_basenames[7]._M_dataplus._M_p = (pointer)&variable_basenames[7].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(variable_basenames + 7),"v8","");
  lVar2 = 0x10;
  do {
    puVar5 = (undefined1 *)((long)&full_variable_names[0]._M_dataplus._M_p + lVar2);
    *(undefined1 **)((long)&variable_basenames[7].field_2 + lVar2) = puVar5;
    *(undefined8 *)((long)&variable_basenames[7].field_2 + lVar2 + 8) = 0;
    *puVar5 = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x110);
  lVar2 = 1;
  lVar6 = 0;
  do {
    lVar1 = *(long *)((long)&variable_basenames[0]._M_dataplus._M_p + lVar6);
    local_258[0] = &local_248;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_258,lVar1,
               *(long *)((long)&variable_basenames[0]._M_string_length + lVar6) + lVar1);
    local_480[0] = local_470;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"[2]","");
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(&shader_source,this,(string *)local_258,(string *)local_480,lVar2);
    std::__cxx11::string::operator=
              ((string *)((long)&full_variable_names[0]._M_dataplus._M_p + lVar6),
               (string *)&shader_source);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
      operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_480[0] != local_470) {
      operator_delete(local_480[0],local_470[0] + 1);
    }
    if (local_258[0] != &local_248) {
      operator_delete(local_258[0],local_248 + 1);
    }
    lVar6 = lVar6 + 0x20;
    lVar2 = lVar2 + 1;
  } while (lVar6 != 0x100);
  lVar2 = 8;
  do {
    std::__cxx11::string::append((char *)&base_variable_string);
    std::__cxx11::string::_M_append
              ((char *)&base_variable_string,
               *(ulong *)((long)&variable_basenames[7].field_2 + lVar2 + 8));
    std::__cxx11::string::append((char *)&base_variable_string);
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x108);
  std::__cxx11::string::_M_append
            ((char *)&base_variable_string,(ulong)example_struct1._M_dataplus._M_p);
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"float a","");
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_278,local_298,1);
  std::__cxx11::string::_M_append
            ((char *)&base_variable_string,(ulong)shader_source._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
    operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1);
  }
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  std::__cxx11::string::append((char *)&base_variable_string);
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"float b","");
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_2b8,local_2d8,2);
  std::__cxx11::string::_M_append
            ((char *)&base_variable_string,(ulong)shader_source._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
    operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0],local_2c8[0] + 1);
  }
  if (local_2b8[0] != local_2a8) {
    operator_delete(local_2b8[0],local_2a8[0] + 1);
  }
  std::__cxx11::string::append((char *)&base_variable_string);
  local_2f8[0] = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"float c","");
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_2f8,local_318,3);
  std::__cxx11::string::_M_append
            ((char *)&base_variable_string,(ulong)shader_source._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
    operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  if (local_2f8[0] != local_2e8) {
    operator_delete(local_2f8[0],local_2e8[0] + 1);
  }
  std::__cxx11::string::append((char *)&base_variable_string);
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"float d","");
  local_358[0] = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_338,local_358,4);
  std::__cxx11::string::_M_append
            ((char *)&base_variable_string,(ulong)shader_source._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
    operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1);
  }
  if (local_358[0] != local_348) {
    operator_delete(local_358[0],local_348[0] + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  std::__cxx11::string::append((char *)&base_variable_string);
  local_378[0] = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"float e","");
  local_398[0] = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_378,local_398,5);
  std::__cxx11::string::_M_append
            ((char *)&base_variable_string,(ulong)shader_source._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
    operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1);
  }
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  if (local_378[0] != local_368) {
    operator_delete(local_378[0],local_368[0] + 1);
  }
  std::__cxx11::string::append((char *)&base_variable_string);
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"float f","");
  local_3d8[0] = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_3b8,local_3d8,6);
  std::__cxx11::string::_M_append
            ((char *)&base_variable_string,(ulong)shader_source._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
    operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1);
  }
  if (local_3d8[0] != local_3c8) {
    operator_delete(local_3d8[0],local_3c8[0] + 1);
  }
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  std::__cxx11::string::append((char *)&base_variable_string);
  local_3f8[0] = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"float g","");
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_3f8,local_418,7);
  std::__cxx11::string::_M_append
            ((char *)&base_variable_string,(ulong)shader_source._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
    operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1);
  }
  if (local_418[0] != local_408) {
    operator_delete(local_418[0],local_408[0] + 1);
  }
  if (local_3f8[0] != local_3e8) {
    operator_delete(local_3f8[0],local_3e8[0] + 1);
  }
  std::__cxx11::string::append((char *)&base_variable_string);
  local_438[0] = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"float h","");
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"[2]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_438,local_458,8);
  std::__cxx11::string::_M_append
            ((char *)&base_variable_string,(ulong)shader_source._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
    operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  if (local_438[0] != local_428) {
    operator_delete(local_438[0],local_428[0] + 1);
  }
  std::__cxx11::string::_M_append
            ((char *)&base_variable_string,(ulong)example_struct2._M_dataplus._M_p);
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&shader_source,base_variable_string._M_dataplus._M_p,
             base_variable_string._M_dataplus._M_p + base_variable_string._M_string_length);
  std::__cxx11::string::_M_append((char *)&shader_source,shader_start_abi_cxx11_);
  std::__cxx11::string::append((char *)&shader_source);
  lVar2 = 8;
  do {
    std::__cxx11::string::_M_append((char *)&shader_source,*(ulong *)((long)&uStack_240 + lVar2));
    std::__cxx11::string::append((char *)&shader_source);
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0xe8);
  std::__cxx11::string::_M_append
            ((char *)&shader_source,(ulong)variable_basenames[7]._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&shader_source);
  if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x6b9);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((ulong)tested_shader_type) {
  default:
    goto switchD_00b5c797_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    goto switchD_00b5c797_caseD_0;
  case 3:
    puVar3 = &emit_quad_abi_cxx11_;
    break;
  case 4:
    puVar3 = &set_tesseation_abi_cxx11_;
  }
  std::__cxx11::string::_M_append((char *)&shader_source,*puVar3);
switchD_00b5c797_caseD_0:
  std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
  if (tested_shader_type < SHADER_TYPE_LAST) {
    (*(code *)(&DAT_01b17a98 + *(int *)(&DAT_01b17a98 + (ulong)tested_shader_type * 4)))();
    return;
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x6bc);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SizedDeclarationsFunctionParams<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	size_t		dimension_index = 0;
	std::string example_struct1("\nvoid my_function(");
	std::string example_struct2(")\n"
								"{\n"
								"}\n\n");
	std::string base_variable_string;
	std::string variable_basenames[API::MAX_ARRAY_DIMENSIONS] = { "v1", "v2", "v3", "v4", "v5", "v6", "v7", "v8" };
	std::string full_variable_names[API::MAX_ARRAY_DIMENSIONS];

	for (size_t max_dimension_index = 0; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		full_variable_names[max_dimension_index] =
			this->extend_string(variable_basenames[max_dimension_index], "[2]", max_dimension_index + 1);
	}

	for (size_t max_dimension_index = 0; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		base_variable_string += "float ";
		base_variable_string += full_variable_names[max_dimension_index];
		base_variable_string += ";\n";
	}

	base_variable_string += example_struct1;
	base_variable_string += this->extend_string("float a", "[2]", 1);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float b", "[2]", 2);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float c", "[2]", 3);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float d", "[2]", 4);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float e", "[2]", 5);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float f", "[2]", 6);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float g", "[2]", 7);
	base_variable_string += ", ";
	base_variable_string += this->extend_string("float h", "[2]", 8);
	base_variable_string += example_struct2;

	std::string shader_source = base_variable_string;

	shader_source += shader_start;
	shader_source += "    my_function(";

	for (dimension_index = 0; dimension_index < API::MAX_ARRAY_DIMENSIONS - 1; dimension_index++)
	{
		shader_source += variable_basenames[dimension_index];
		shader_source += ", ";
	}

	shader_source += variable_basenames[dimension_index];
	shader_source += ");\n";

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);

	/* Only the previous case should succeed, so start from index 1 rather than 0.
	 * The other cases should fail, so only compile them, rather than trying to also link them.
	 * We'll swap items 2/3, then 2/4, then 2/5, then 2/6, ...
	 * Then we'll swap items 3/4, then 3/5, ...
	 * Repeat, starting for 4/5-8, 5/6-8, 6/7-8...
	 * Finally, we'll swap items 7/8
	 */
	for (size_t swap_item = 1; swap_item < API::MAX_ARRAY_DIMENSIONS; swap_item++)
	{
		for (size_t max_dimension_index = swap_item + 1; max_dimension_index < API::MAX_ARRAY_DIMENSIONS;
			 max_dimension_index++)
		{
			std::string temp = variable_basenames[swap_item];

			shader_source							= base_variable_string;
			variable_basenames[swap_item]			= variable_basenames[max_dimension_index];
			variable_basenames[max_dimension_index] = temp;

			shader_source += shader_start;
			shader_source += "    my_function(";

			for (dimension_index = 0; dimension_index < API::MAX_ARRAY_DIMENSIONS - 1; dimension_index++)
			{
				shader_source += variable_basenames[dimension_index];
				shader_source += ", ";
			}

			shader_source += variable_basenames[dimension_index];
			shader_source += ");\n";

			temp									= variable_basenames[swap_item];
			variable_basenames[swap_item]			= variable_basenames[max_dimension_index];
			variable_basenames[max_dimension_index] = temp;

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* for (int max_dimension_index = swap_item + 1; ...) */
	}	 /* for (int swap_item = 1; ...) */
}